

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

void __thiscall QSqlTableModelPrivate::revertCachedRow(QSqlTableModelPrivate *this,int row)

{
  QSqlRecord *this_00;
  _Rb_tree_color _Var1;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> this_01;
  Op OVar2;
  int iVar3;
  ModifiedRow *pMVar4;
  iterator iVar5;
  const_iterator cVar6;
  iterator afirst;
  QSqlRecord *pQVar7;
  CacheMap *this_02;
  long in_FS_OFFSET;
  QSqlRecord local_98;
  undefined8 local_90;
  totally_ordered_wrapper<QSqlRecordPrivate_*> local_88;
  Op local_7c;
  ModifiedRow local_78;
  ModifiedRow local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01.d.ptr =
       *(totally_ordered_wrapper<QSqlRecordPrivate_*> *)
        &(this->super_QSqlQueryModelPrivate).field_0x8;
  this_02 = &this->cache;
  local_58.m_db_values.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
  local_58.m_submitted = true;
  local_58.m_insert = true;
  local_58._26_6_ = 0xaaaaaaaaaaaa;
  local_58.m_op = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58.m_rec.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
  local_7c = row;
  QSqlRecord::QSqlRecord(&local_98);
  pQVar7 = &local_78.m_rec;
  local_78.m_op = None;
  QSqlRecord::QSqlRecord(pQVar7);
  this_00 = &local_78.m_db_values;
  QSqlRecord::QSqlRecord(this_00,&local_98);
  local_78._24_2_ = 1;
  if (local_78.m_op != None) {
    local_78.m_submitted = true;
    local_78.m_op = None;
    QSqlRecord::operator=(pQVar7,this_00);
    OVar2 = local_78.m_op;
    iVar3 = QSqlRecord::count(pQVar7);
    if (0 < iVar3) {
      iVar3 = iVar3 + 1;
      do {
        QSqlRecord::setGenerated(pQVar7,iVar3 + -2,OVar2 == Delete);
        iVar3 = iVar3 + -1;
      } while (1 < iVar3);
    }
  }
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value(&local_58,this_02,(int *)&local_7c,&local_78)
  ;
  QSqlRecord::~QSqlRecord(this_00);
  QSqlRecord::~QSqlRecord(pQVar7);
  QSqlRecord::~QSqlRecord(&local_98);
  if (local_58.m_op - Update < 2) {
    if (local_58.m_submitted == false) {
      pMVar4 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[](this_02,(int *)&local_7c);
      if (pMVar4->m_submitted == false) {
        if (pMVar4->m_op == Delete) {
          pMVar4->m_op = Update;
        }
        pQVar7 = &pMVar4->m_rec;
        QSqlRecord::operator=(pQVar7,&pMVar4->m_db_values);
        iVar3 = QSqlRecord::count(pQVar7);
        if (0 < iVar3) {
          iVar3 = iVar3 + 1;
          do {
            QSqlRecord::setGenerated(pQVar7,iVar3 + -2,false);
            iVar3 = iVar3 + -1;
          } while (1 < iVar3);
        }
        pMVar4->m_submitted = true;
      }
      OVar2 = local_7c;
      local_78.m_op = local_7c;
      local_78._4_4_ = 0;
      local_78.m_rec.d.d.ptr =
           (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
           (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
      local_78.m_db_values.d.d.ptr =
           (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
           (QExplicitlySharedDataPointer<QSqlRecordPrivate>)this_01.d.ptr;
      local_98.d.d.ptr._4_4_ = (**(code **)(*(long *)this_01.d.ptr + 0x80))(this_01.d.ptr);
      local_98.d.d.ptr._4_4_ = local_98.d.d.ptr._4_4_ + -1;
      local_98.d.d.ptr._0_4_ = OVar2;
      local_90 = 0;
      local_88 = this_01.d.ptr;
      QAbstractItemModel::dataChanged
                ((QModelIndex *)this_01.d.ptr,(QModelIndex *)&local_78,(QList *)&local_98);
    }
  }
  else if (local_58.m_op == Insert) {
    iVar5 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::find(this_02,(int *)&local_7c);
    QMap<int,_QSqlTableModelPrivate::ModifiedRow>::detach(this_02);
    if (iVar5.i._M_node != (iterator)&(((this_02->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header)
    {
      local_78.m_op = ~None;
      local_78._4_4_ = 0xffffffff;
      local_78.m_rec.d.d.ptr =
           (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
           (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
      local_78.m_db_values.d.d.ptr =
           (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
           (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
      QSqlQueryModel::beginRemoveRows
                ((QSqlQueryModel *)this_01.d.ptr,(QModelIndex *)&local_78,local_7c,local_7c);
      cVar6.i._M_node =
           (const_iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)iVar5.i._M_node);
      afirst._M_node =
           (_Base_ptr)
           QMap<int,_QSqlTableModelPrivate::ModifiedRow>::erase(this_02,iVar5.i._M_node,cVar6);
      QMap<int,_QSqlTableModelPrivate::ModifiedRow>::detach(this_02);
      if ((_Rb_tree_header *)afirst._M_node !=
          &(((this_02->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
        do {
          _Var1 = afirst._M_node[1]._M_color;
          local_78.m_db_values.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
          local_78.m_submitted = true;
          local_78.m_insert = true;
          local_78._26_2_ = 0xaaaa;
          local_78._28_4_ = 0xaaaaaaaa;
          local_78.m_rec.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
          local_78.m_op = *(Op *)&afirst._M_node[1]._M_parent;
          local_78._4_4_ = 0xaaaaaaaa;
          QSqlRecord::QSqlRecord(&local_78.m_rec,(QSqlRecord *)&afirst._M_node[1]._M_left);
          QSqlRecord::QSqlRecord(&local_78.m_db_values,(QSqlRecord *)&afirst._M_node[1]._M_right);
          local_78._24_2_ = (short)afirst._M_node[2]._M_color;
          cVar6.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::erase
                    (this_02,(const_iterator)afirst._M_node,cVar6);
          local_98.d.d.ptr._0_4_ = _Var1 - _S_black;
          iVar5 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::insert
                            (this_02,(int *)&local_98,&local_78);
          afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5.i._M_node);
          QSqlRecord::~QSqlRecord(&local_78.m_db_values);
          QSqlRecord::~QSqlRecord(&local_78.m_rec);
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::detach(this_02);
        } while ((_Rb_tree_header *)afirst._M_node !=
                 &(((this_02->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
      }
      QSqlQueryModel::endRemoveRows((QSqlQueryModel *)this_01.d.ptr);
    }
  }
  QSqlRecord::~QSqlRecord(&local_58.m_db_values);
  QSqlRecord::~QSqlRecord(&local_58.m_rec);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSqlTableModelPrivate::revertCachedRow(int row)
{
    Q_Q(QSqlTableModel);
    ModifiedRow r = cache.value(row);

    switch (r.op()) {
    case QSqlTableModelPrivate::None:
        Q_ASSERT_X(false, "QSqlTableModelPrivate::revertCachedRow()", "Invalid entry in cache map");
        return;
    case QSqlTableModelPrivate::Update:
    case QSqlTableModelPrivate::Delete:
        if (!r.submitted()) {
            cache[row].revert();
            emit q->dataChanged(q->createIndex(row, 0),
                                q->createIndex(row, q->columnCount() - 1));
        }
        break;
    case QSqlTableModelPrivate::Insert: {
            QMap<int, QSqlTableModelPrivate::ModifiedRow>::Iterator it = cache.find(row);
            if (it == cache.end())
                return;
            q->beginRemoveRows(QModelIndex(), row, row);
            it = cache.erase(it);
            while (it != cache.end()) {
                int oldKey = it.key();
                const QSqlTableModelPrivate::ModifiedRow oldValue = it.value();
                cache.erase(it);
                it = cache.insert(oldKey - 1, oldValue);
                ++it;
            }
            q->endRemoveRows();
        break; }
    }
}